

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariableMultiplicationGeneralizationImpl.hpp
# Opt level: O2

Result Inferences::VariableMultiplicationGeneralizationImpl::applyRule
                 (Clause *cl,bool doOrderingCheck)

{
  char *pcVar1;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  *pDVar2;
  VariableRegion *pVVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  Clause *pCVar7;
  undefined4 uVar8;
  Clause *cl_00;
  Clause *extraout_RDX;
  Clause *extraout_RDX_00;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  *other;
  Elem var;
  Variable obj;
  uint uVar9;
  Result RVar10;
  anon_class_16_2_d708292f f;
  EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize> eval;
  StlIter __begin2;
  Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> varRegions;
  IntMap<Kernel::Variable> varMap;
  StlIter __begin2_1;
  AnyNumber<Kernel::MonomFactor> varPower;
  Elem poly;
  IntUnionFind components;
  _ElementType out;
  undefined1 local_398 [8];
  AnyNumber<Kernel::MonomFactor> *pAStack_390;
  AnyNumber<Kernel::MonomFactor> *local_388;
  SplitSet *pSStack_380;
  void *local_378;
  void *pvStack_370;
  char local_368 [24];
  undefined1 local_350 [8];
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>
  local_348 [4];
  Value local_344;
  void *local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  Value VStack_318;
  OptionBase<Kernel::PolyNf::SubtermIter> local_308;
  OptionBase<Kernel::Variable> local_2e0;
  Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> local_2d8;
  IntMap<Kernel::Variable> local_2b8;
  StlIter local_278;
  undefined1 local_258 [12];
  uint uStack_24c;
  AnyNumber<Kernel::MonomFactor> *local_248;
  anon_class_8_1_54a39801_for__func aStack_240;
  uint local_238;
  OptionBase<Kernel::PolyNf::SubtermIter> local_210;
  undefined1 local_1d0 [5];
  undefined4 uStack_1cb;
  undefined3 uStack_1bf;
  OptionBase<Kernel::PolyNf::SubtermIter> local_190;
  undefined1 local_168 [64];
  OptionBase<Kernel::PolyNf::SubtermIter> local_128;
  undefined1 local_100 [16];
  Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion> *local_f0;
  OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> local_e0;
  OptionBase<Kernel::PolyNf::SubtermIter> local_b8;
  DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
  local_88;
  IterTraits<Lib::IntUnionFind::ComponentIterator> local_68;
  AnyNumber<Kernel::MonomFactor> local_50;
  
  IntMap<Kernel::Variable>::IntMap(&local_2b8);
  Inferences::anon_class_1_0_00000001::operator()
            ((IterTraits<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>_>
              *)local_1d0,(anon_class_1_0_00000001 *)cl,cl_00);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::Literal*)#1},Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1},Kernel::PolyNf::SubtermIter>>
  ::operator()((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>
                *)local_168,
               (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>
                *)local_1d0);
  Lib::
  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::Literal*)#1},Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1},Kernel::PolyNf::SubtermIter>>
  ::operator()(local_348,
               (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>
                *)local_168);
  local_2e0._isSome = false;
  local_2e0._1_3_ = 0;
  local_2e0._elem._elem = (Value)0x0;
  Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::Literal*)#1},Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1},Kernel::PolyNf::SubtermIter>>,Inferences::$_8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1}>
  ::operator()((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
                *)local_258,
               (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                *)local_350);
  Lib::
  FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::{lambda(auto:1)#1},Kernel::Literal*&>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::Literal*)#1},Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::$_6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1},Kernel::PolyNf::SubtermIter>>,Inferences::$_8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::{lambda(Kernel::PolyNf)#1}>
  ::operator()((FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
                *)local_100,
               (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>
                *)local_258);
  Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_210);
  Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_308);
  Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_128);
  Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase
            (&(((FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>
                 *)local_1d0)->_current).super_OptionBase<Kernel::PolyNf::SubtermIter>);
  local_258._0_8_ =
       (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
        *)local_100;
  Lib::
  IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>_>
  ::tryNext((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>_>
             *)(local_258 + 8));
  bVar4 = local_258[8];
  obj._num = uStack_24c;
  while ((bVar4 & 1) != 0) {
    IntMap<Kernel::Variable>::insert(&local_2b8,obj);
    Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:77:16)>_>
    ::tryNext((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:77:16)>_>
               *)local_350);
    bVar4 = local_350[0];
    if (local_350[0] != 0) {
      obj._num = local_350._4_4_;
    }
  }
  Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_b8);
  iVar6 = (int)((ulong)((long)local_2b8._stack._cursor - (long)local_2b8._stack._stack) >> 2);
  if (iVar6 == 0) {
    uVar8 = 0;
  }
  else {
    Lib::IntUnionFind::IntUnionFind((IntUnionFind *)local_168,iVar6);
    Lib::Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>::Stack
              (&local_2d8,
               (ulong)((long)local_2b8._stack._cursor - (long)local_2b8._stack._stack) >> 2 &
               0xffffffff);
    pCVar7 = extraout_RDX;
    for (uVar9 = 0;
        uVar9 < (uint)((ulong)((long)local_2b8._stack._cursor - (long)local_2b8._stack._stack) >> 2)
        ; uVar9 = uVar9 + 1) {
      pvStack_370 = (void *)0x0;
      local_368[0] = '\0';
      local_368[1] = '\0';
      local_368[2] = '\0';
      local_368[3] = '\0';
      local_368[4] = '\0';
      local_368[5] = '\0';
      local_368[6] = '\0';
      local_368[7] = '\0';
      local_368[8] = '\0';
      local_368[9] = '\0';
      local_368[10] = '\0';
      local_368[0xb] = '\0';
      local_368[0xc] = '\0';
      local_368[0xd] = '\0';
      local_368[0xe] = '\0';
      local_368[0xf] = '\0';
      local_368[0x10] = '\0';
      local_368[0x11] = '\0';
      local_368[0x12] = '\0';
      local_368[0x13] = '\0';
      local_378 = (void *)0x1;
      Lib::Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>::push
                (&local_2d8,(VariableRegion *)&local_378);
      Lib::CoproductImpl::TrivialOperations::Destr::
      DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
      ::~DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
                      *)&local_378);
      pCVar7 = extraout_RDX_00;
    }
    Inferences::anon_class_1_0_00000001::operator()
              ((IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
                *)local_258,(anon_class_1_0_00000001 *)cl,pCVar7);
    Lib::
    IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
    ::begin((StlIter *)local_350,
            (IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:70:16)>_>
             *)local_258);
    while (local_348[0] !=
           (FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>
            )0x0) {
      uStack_1cb._0_3_ = 0;
      uStack_1cb._3_1_ = 0;
      uStack_1bf = 0;
      local_1d0[0] = local_344._0_1_ & 3;
      local_1d0._1_4_ = local_344._1_4_;
      local_100._0_8_ = local_168;
      f.this = (Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
                *)local_1d0;
      f.f = (Preprocess *)local_100;
      local_100._8_8_ = &local_2b8;
      local_f0 = &local_2d8;
      Lib::CoproductImpl::
      RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>
      ::
      switchN<Lib::Coproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>::apply<Inferences::VariableMultiplicationGeneralizationImpl::Preprocess>(Inferences::VariableMultiplicationGeneralizationImpl::Preprocess)&::_lambda(auto:1)_1_>
                ((RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>,Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>>,Lib::PerfectIdComparison>>
                  *)local_1d0,f);
      Lib::
      IterTraits<Lib::FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Lib/Metaiterators.hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:32:14),_Kernel::PolyNf::SubtermIter>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization.cpp:70:16)>_>
      ::StlIter::operator++((StlIter *)local_350);
    }
    Lib::OptionBase<Kernel::PolyNf::SubtermIter>::~OptionBase(&local_210);
    local_388 = (AnyNumber<Kernel::MonomFactor> *)0x0;
    pSStack_380 = (SplitSet *)0x0;
    local_398 = (undefined1  [8])0x0;
    pAStack_390 = (AnyNumber<Kernel::MonomFactor> *)0x0;
    Lib::IntUnionFind::evalComponents((IntUnionFind *)local_168);
    local_68._iter._cit.super_ConstRefIterator._stack = (Stack<int> *)(local_168 + 0x18);
    local_68._iter._cit.super_ConstRefIterator._pointer = (int *)local_168._40_8_;
    local_68._iter._data = (int *)local_168._16_8_;
    Lib::IterTraits<Lib::IntUnionFind::ComponentIterator>::StlIter::StlIter(&local_278,&local_68);
    pCVar7 = (Clause *)local_168._16_8_;
    while (local_278._cur.super_OptionBase<Lib::IntUnionFind::ElementIterator>._isSome != false) {
      iVar6 = Lib::IntUnionFind::root
                        ((IntUnionFind *)local_168,
                         local_278._cur.super_OptionBase<Lib::IntUnionFind::ElementIterator>._elem.
                         _elem.init._next);
      pVVar3 = local_2d8._stack;
      if ((undefined1  [36])
          ((undefined1  [36])
           local_2d8._stack[iVar6]._self._inner.
           super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
           .
           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
           .
           super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>
          & (undefined1  [36])0x1) == (undefined1  [36])0x0) {
        pcVar1 = local_2d8._stack[iVar6]._self._inner.
                 super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                 .
                 super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
                 .
                 super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>
                 ._content;
        pCVar7 = *(Clause **)
                  (local_2d8._stack[iVar6]._self._inner.
                   super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                   .
                   super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
                   .
                   super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>
                   ._content + 0x10);
        local_344.init.super_AnyPolySuper._inner.
        super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>_>
        .
        super_RawCoproduct<Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>,_Lib::Perfect<Kernel::Polynom<Kernel::NumTraits<Kernel::RealConstantType>_>,_Lib::PerfectIdComparison>_>
        ._content[3] = (char)pCVar7;
        local_344._5_4_ = (undefined4)((ulong)pCVar7 >> 8);
        local_344._9_3_ = (undefined3)((ulong)pCVar7 >> 0x28);
        local_344._12_5_ = SUB85(pcVar1,0);
        local_344._17_3_ = (undefined3)((ulong)pcVar1 >> 0x28);
        local_320 = 0;
        VStack_318.init._iter._lit = (Literal *)0x0;
        local_330 = (void *)0x0;
        uStack_328 = 0;
        VStack_318.init._iter._idx = 0;
        Lib::
        FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>
        ::FilteredIterator((FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
                            *)local_258,
                           (FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
                            *)local_350);
        Lib::
        FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>
        ::FilteredIterator((FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
                            *)local_100,
                           (FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
                            *)local_258);
        bVar5 = Lib::
                FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>
                ::hasNext((FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
                           *)local_100);
        if (bVar5) {
          Lib::
          FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/Inferences/ArithmeticSubtermGeneralization/VariableMultiplicationGeneralizationImpl.hpp:267:17),_false>
          ::hasNext((FilteredIterator<Lib::MappingIterator<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::RefIterator,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:266:14),_Inferences::AnyNumber<Kernel::MonomFactor>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_VariableMultiplicationGeneralizationImpl_hpp:267:17),_false>
                     *)local_100);
          Lib::CoproductImpl::TrivialOperations::MoveCons::
          DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ::DefaultImpl(&local_88,
                        (DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                         *)&local_e0._elem);
          local_248 = (AnyNumber<Kernel::MonomFactor> *)0x0;
          aStack_240.a = (Clause *)0x0;
          local_258._0_8_ =
               (FilterMapIter<Lib::FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,Lib::arrayIter<Kernel::Clause,unsigned_int>(Kernel::Clause&,unsigned_int)::_lambda(auto:1)_1_,Kernel::Literal*&>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::Literal*)_1_,Lib::IterTraits<Kernel::IterArgsPnf>>>,Inferences::__6::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_,Kernel::PolyNf::SubtermIter>>,Inferences::__8::TEMPNAMEPLACEHOLDERVALUE(Kernel::Clause*)const::_lambda(Kernel::PolyNf)_1_>
                *)0x0;
          stack0xfffffffffffffdb0 = 0;
          local_238 = 0;
          Lib::OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::operator=
                    (&local_e0,(OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> *)local_258)
          ;
          Lib::CoproductImpl::TrivialOperations::MoveCons::
          DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
          ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                         *)local_350,&local_88);
          Lib::OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_>::OptionBase
                    ((OptionBase<Inferences::AnyNumber<Kernel::MonomFactor>_> *)local_1d0,
                     (AnyNumber<Kernel::MonomFactor> *)local_350);
          if ((local_1d0[0] & 1) != 0) {
            pDVar2 = *(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                       **)(pVVar3[iVar6]._self._inner.
                           super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                           .
                           super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
                           .
                           super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>
                           ._content + 0x10);
            for (other = *(DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           **)(pVVar3[iVar6]._self._inner.
                               super_DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>_>
                               .
                               super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>_>
                               .
                               super_RawCoproduct<Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>,_Inferences::Top>
                               ._content + 8); other != pDVar2; other = other + 1) {
              Lib::CoproductImpl::TrivialOperations::CopyCons::
              DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
              ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                             *)local_258,other);
              bVar5 = Lib::operator!=((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                       *)local_258,
                                      (Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                       *)((long)&((
                                                  FlatteningIterator<Lib::MappingIterator<Lib::FlatteningIterator<Lib::MappingIterator<Lib::IterTraits<Lib::MappingIterator<Lib::RangeIterator<unsigned_int>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Metaiterators_hpp:1778:65),_Kernel::Literal_*&>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:31:14),_Lib::IterTraits<Kernel::IterArgsPnf>_>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Inferences_ArithmeticSubtermGeneralization_cpp:32:14),_Kernel::PolyNf::SubtermIter>_>
                                                  *)local_1d0)->_master + 4));
              if (bVar5) {
                Lib::CoproductImpl::TrivialOperations::CopyCons::
                DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                               *)&local_50,
                              (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                               *)local_258);
                Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::push
                          ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)local_398,&local_50
                          );
              }
            }
          }
        }
      }
      Lib::IterTraits<Lib::IntUnionFind::ComponentIterator>::StlIter::operator++(&local_278);
    }
    if (local_388 == pAStack_390) {
      uVar8 = 0;
    }
    else {
      std::__sort<Inferences::AnyNumber<Kernel::MonomFactor>*,__gnu_cxx::__ops::_Iter_less_iter>();
      eval.eval.toRem = (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)(ulong)doOrderingCheck
      ;
      eval.eval._8_8_ = pCVar7;
      RVar10 = generalizeBottomUp<Inferences::EvaluateMonom<Inferences::VariableMultiplicationGeneralizationImpl::Generalize>>
                         ((Inferences *)cl,(Clause *)local_398,eval);
      cl = RVar10.simplified;
      uVar8 = RVar10._8_4_;
    }
    Lib::Stack<Inferences::AnyNumber<Kernel::MonomFactor>_>::~Stack
              ((Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)local_398);
    Lib::Stack<Inferences::VariableMultiplicationGeneralizationImpl::VariableRegion>::~Stack
              (&local_2d8);
    Lib::IntUnionFind::~IntUnionFind((IntUnionFind *)local_168);
  }
  IntMap<Kernel::Variable>::~IntMap(&local_2b8);
  RVar10._8_4_ = uVar8;
  RVar10.simplified = cl;
  RVar10._12_4_ = 0;
  return RVar10;
}

Assistant:

SimplifyingGeneratingInference1::Result applyRule(Clause* cl, bool doOrderingCheck) 
{
  DEBUG("input clause: ", *cl);
  IntMap<Variable> varMap;

  /* initialization */
  for (auto var : iterVars(cl)) {
    varMap.insert(var);
  }
  if (varMap.size() == 0) {
    DEBUG("no variables. generalization not applicable");
    return SimplifyingGeneratingInference1::Result::nop(cl);
  }

  IntUnionFind components(varMap.size());
  Stack<VariableRegion> varRegions(varMap.size());;
  for (unsigned i = 0; i < varMap.size(); i++)  {
    varRegions.push(VariableRegion());
  }

  /* preprocessing. finds all products `X0 ⋅ X1 ⋅ ... ⋅ Xn` such that the rule is applicable */
  for (auto poly : iterPolynoms(cl)) {
    poly.apply(Preprocess {components, varMap, varRegions});
  }


  /* create a stack of all variables that shall be removed in the final step */

  Stack<AnyNumber<MonomFactor>> remove;

  components.evalComponents();
  for (auto comp : iterTraits(IntUnionFind::ComponentIterator(components))) {
    auto& maybeRegion = varRegions[components.root(comp.next())];
    if (maybeRegion.isInit()) {
      auto& region = maybeRegion.unwrap();

      /* one variable with power one needs to be kept, per varible region */
      auto var = iterTraits(region.iter())
        .map([](auto& x) { return x; })
        .filter([](auto& p) { return p.apply([](auto& t){ return t.tryVar(); }).isSome(); })
        .tryNext();

      if (var.isSome()) {
        for (auto varPower : region) {
          if (varPower != var.unwrap()) {
            remove.push(varPower);
          }
        }
      }
    }
  }

  /* apply the substitution `X0 ⋅ X1 ⋅ ... ⋅ Xn ==> X0`  */
  DEBUG("removing variables: ", remove)
  if (remove.isEmpty()) {
    return SimplifyingGeneratingInference1::Result::nop(cl);
  } else {
    std::sort(remove.begin(), remove.end());
    Generalize gen { remove, doOrderingCheck };
    return generalizeBottomUp(cl, EvaluateMonom<Generalize> {gen});
  }
}